

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_striped_sse41_128_32.c
# Opt level: O1

parasail_result_t *
parasail_nw_table_striped_profile_sse41_128_32
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  int *piVar1;
  uint *puVar2;
  int iVar3;
  void *pvVar4;
  parasail_matrix_t *ppVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  parasail_result_t *ppVar10;
  __m128i *ptr;
  __m128i *palVar11;
  __m128i *ptr_00;
  int32_t *ptr_01;
  long lVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  int iVar16;
  ulong uVar17;
  int iVar18;
  int iVar19;
  int32_t segNum;
  long lVar20;
  long lVar21;
  __m128i *ptr_02;
  ulong uVar22;
  long lVar23;
  int iVar24;
  long lVar25;
  ulong uVar26;
  long lVar27;
  bool bVar28;
  undefined1 auVar29 [16];
  uint uVar30;
  uint uVar32;
  uint uVar33;
  uint uVar34;
  undefined1 auVar31 [16];
  uint uVar35;
  uint uVar36;
  uint uVar37;
  uint uVar38;
  uint uVar39;
  uint uVar40;
  uint uVar41;
  uint uVar42;
  int iVar43;
  uint uVar45;
  uint uVar46;
  uint uVar47;
  uint uVar48;
  uint uVar49;
  uint uVar51;
  int iVar52;
  uint uVar53;
  int iVar54;
  uint uVar55;
  int iVar56;
  undefined1 auVar50 [16];
  int iVar57;
  int iVar58;
  int iVar59;
  int iVar60;
  __m128i_32_t e;
  __m128i_32_t h;
  longlong local_58;
  longlong lStack_50;
  longlong local_48;
  longlong lStack_40;
  int32_t iVar44;
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_nw_table_striped_profile_sse41_128_32_cold_8();
  }
  else {
    pvVar4 = (profile->profile32).score;
    if (pvVar4 == (void *)0x0) {
      parasail_nw_table_striped_profile_sse41_128_32_cold_7();
    }
    else {
      ppVar5 = profile->matrix;
      if (ppVar5 == (parasail_matrix_t *)0x0) {
        parasail_nw_table_striped_profile_sse41_128_32_cold_6();
      }
      else {
        uVar30 = profile->s1Len;
        if ((int)uVar30 < 1) {
          parasail_nw_table_striped_profile_sse41_128_32_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_nw_table_striped_profile_sse41_128_32_cold_4();
        }
        else {
          uVar22 = (ulong)(uint)s2Len;
          if (s2Len < 1) {
            parasail_nw_table_striped_profile_sse41_128_32_cold_3();
          }
          else if (open < 0) {
            parasail_nw_table_striped_profile_sse41_128_32_cold_2();
          }
          else if (gap < 0) {
            parasail_nw_table_striped_profile_sse41_128_32_cold_1();
          }
          else {
            iVar6 = uVar30 - 1;
            uVar17 = (ulong)uVar30 + 3 >> 2;
            iVar16 = (int)uVar17;
            iVar24 = -open;
            iVar18 = ppVar5->min;
            uVar13 = 0x80000000 - iVar18;
            if (iVar18 != iVar24 && SBORROW4(iVar18,iVar24) == iVar18 + open < 0) {
              uVar13 = open | 0x80000000;
            }
            uVar7 = 0x7ffffffe - ppVar5->max;
            ppVar10 = parasail_result_new_table1((uint)((ulong)uVar30 + 3) & 0x7ffffffc,s2Len);
            if (ppVar10 != (parasail_result_t *)0x0) {
              ppVar10->flag = ppVar10->flag | 0x4420801;
              ptr = parasail_memalign___m128i(0x10,uVar17);
              palVar11 = parasail_memalign___m128i(0x10,uVar17);
              ptr_00 = parasail_memalign___m128i(0x10,uVar17);
              ptr_01 = parasail_memalign_int32_t(0x10,(ulong)(s2Len + 1));
              if ((ptr_01 != (int32_t *)0x0 && ptr_00 != (__m128i *)0x0) &&
                  (palVar11 != (__m128i *)0x0 && ptr != (__m128i *)0x0)) {
                iVar8 = s2Len + -1;
                iVar9 = 3 - iVar6 / iVar16;
                uVar13 = uVar13 + 1;
                uVar14 = 0;
                iVar18 = iVar24;
                do {
                  lVar20 = 0;
                  iVar19 = iVar18;
                  do {
                    *(int *)((long)&local_48 + lVar20 * 4) = iVar19;
                    lVar21 = (long)iVar19 - (ulong)(uint)open;
                    if (lVar21 < -0x7fffffff) {
                      lVar21 = -0x80000000;
                    }
                    *(int *)((long)&local_58 + lVar20 * 4) = (int)lVar21;
                    lVar20 = lVar20 + 1;
                    iVar19 = iVar19 - gap * iVar16;
                  } while (lVar20 != 4);
                  ptr[uVar14][0] = local_48;
                  ptr[uVar14][1] = lStack_40;
                  ptr_00[uVar14][0] = local_58;
                  ptr_00[uVar14][1] = lStack_50;
                  uVar14 = uVar14 + 1;
                  iVar18 = iVar18 - gap;
                } while (uVar14 != uVar17);
                *ptr_01 = 0;
                uVar14 = 1;
                do {
                  ptr_01[uVar14] = iVar24;
                  uVar14 = uVar14 + 1;
                  iVar24 = iVar24 - gap;
                } while (s2Len + 1 != uVar14);
                uVar14 = 1;
                if (1 < s2Len) {
                  uVar14 = uVar22;
                }
                lVar21 = uVar17 * uVar22;
                lVar20 = (ulong)(iVar16 + (uint)(iVar16 == 0)) << 4;
                lVar27 = 0;
                uVar15 = 0;
                uVar30 = uVar13;
                uVar32 = uVar13;
                uVar33 = uVar13;
                uVar34 = uVar13;
                uVar35 = uVar7;
                uVar36 = uVar7;
                uVar37 = uVar7;
                uVar38 = uVar7;
                do {
                  ptr_02 = ptr;
                  ptr = palVar11;
                  iVar3 = ppVar5->mapper[(byte)s2[uVar15]];
                  palVar11 = ptr_02 + (iVar16 - 1);
                  iVar18 = (int)(*palVar11)[0];
                  iVar24 = *(int *)((long)*palVar11 + 4);
                  iVar19 = (int)(*palVar11)[1];
                  iVar44 = ptr_01[uVar15];
                  lVar25 = 0;
                  lVar23 = lVar27;
                  uVar39 = uVar13;
                  uVar40 = uVar13;
                  uVar41 = uVar13;
                  uVar42 = uVar13;
                  do {
                    piVar1 = (int *)((long)pvVar4 + lVar25 + uVar17 * (long)iVar3 * 0x10);
                    iVar43 = iVar44 + *piVar1;
                    iVar18 = iVar18 + piVar1[1];
                    iVar24 = iVar24 + piVar1[2];
                    iVar19 = iVar19 + piVar1[3];
                    piVar1 = (int *)((long)*ptr_00 + lVar25);
                    iVar57 = *piVar1;
                    iVar58 = piVar1[1];
                    iVar59 = piVar1[2];
                    iVar60 = piVar1[3];
                    uVar49 = (iVar57 < (int)uVar39) * uVar39 |
                             (uint)(iVar57 >= (int)uVar39) * iVar57;
                    uVar51 = (iVar58 < (int)uVar40) * uVar40 |
                             (uint)(iVar58 >= (int)uVar40) * iVar58;
                    uVar53 = (iVar59 < (int)uVar41) * uVar41 |
                             (uint)(iVar59 >= (int)uVar41) * iVar59;
                    uVar55 = (iVar60 < (int)uVar42) * uVar42 |
                             (uint)(iVar60 >= (int)uVar42) * iVar60;
                    uVar49 = (uint)((int)uVar49 < iVar43) * iVar43 |
                             ((int)uVar49 >= iVar43) * uVar49;
                    uVar51 = (uint)((int)uVar51 < iVar18) * iVar18 |
                             ((int)uVar51 >= iVar18) * uVar51;
                    uVar53 = (uint)((int)uVar53 < iVar24) * iVar24 |
                             ((int)uVar53 >= iVar24) * uVar53;
                    uVar55 = (uint)((int)uVar55 < iVar19) * iVar19 |
                             ((int)uVar55 >= iVar19) * uVar55;
                    puVar2 = (uint *)((long)*ptr + lVar25);
                    *puVar2 = uVar49;
                    puVar2[1] = uVar51;
                    puVar2[2] = uVar53;
                    puVar2[3] = uVar55;
                    uVar30 = ((int)uVar30 < (int)uVar49) * uVar49 |
                             ((int)uVar30 >= (int)uVar49) * uVar30;
                    uVar32 = ((int)uVar32 < (int)uVar51) * uVar51 |
                             ((int)uVar32 >= (int)uVar51) * uVar32;
                    uVar33 = ((int)uVar33 < (int)uVar53) * uVar53 |
                             ((int)uVar33 >= (int)uVar53) * uVar33;
                    uVar34 = ((int)uVar34 < (int)uVar55) * uVar55 |
                             ((int)uVar34 >= (int)uVar55) * uVar34;
                    uVar35 = (uint)(iVar57 < (int)uVar35) * iVar57 |
                             (iVar57 >= (int)uVar35) * uVar35;
                    uVar36 = (uint)(iVar58 < (int)uVar36) * iVar58 |
                             (iVar58 >= (int)uVar36) * uVar36;
                    uVar37 = (uint)(iVar59 < (int)uVar37) * iVar59 |
                             (iVar59 >= (int)uVar37) * uVar37;
                    uVar38 = (uint)(iVar60 < (int)uVar38) * iVar60 |
                             (iVar60 >= (int)uVar38) * uVar38;
                    piVar1 = ((ppVar10->field_4).rowcols)->score_row;
                    *(uint *)((long)piVar1 + lVar23) = uVar49;
                    *(uint *)((long)piVar1 + lVar21 * 4 + lVar23) = uVar51;
                    *(uint *)((long)piVar1 + lVar21 * 8 + lVar23) = uVar53;
                    *(uint *)((long)piVar1 + lVar21 * 0xc + lVar23) = uVar55;
                    uVar35 = ((int)uVar39 < (int)uVar35) * uVar39 |
                             ((int)uVar39 >= (int)uVar35) * uVar35;
                    uVar36 = ((int)uVar40 < (int)uVar36) * uVar40 |
                             ((int)uVar40 >= (int)uVar36) * uVar36;
                    uVar37 = ((int)uVar41 < (int)uVar37) * uVar41 |
                             ((int)uVar41 >= (int)uVar37) * uVar37;
                    uVar38 = ((int)uVar42 < (int)uVar38) * uVar42 |
                             ((int)uVar42 >= (int)uVar38) * uVar38;
                    uVar35 = ((int)uVar49 < (int)uVar35) * uVar49 |
                             ((int)uVar49 >= (int)uVar35) * uVar35;
                    uVar36 = ((int)uVar51 < (int)uVar36) * uVar51 |
                             ((int)uVar51 >= (int)uVar36) * uVar36;
                    uVar37 = ((int)uVar53 < (int)uVar37) * uVar53 |
                             ((int)uVar53 >= (int)uVar37) * uVar37;
                    uVar38 = ((int)uVar55 < (int)uVar38) * uVar55 |
                             ((int)uVar55 >= (int)uVar38) * uVar38;
                    iVar43 = uVar49 - open;
                    iVar52 = uVar51 - open;
                    iVar54 = uVar53 - open;
                    iVar56 = uVar55 - open;
                    iVar57 = iVar57 - gap;
                    iVar58 = iVar58 - gap;
                    iVar59 = iVar59 - gap;
                    iVar60 = iVar60 - gap;
                    puVar2 = (uint *)((long)*ptr_00 + lVar25);
                    *puVar2 = (uint)(iVar57 < iVar43) * iVar43 | (uint)(iVar57 >= iVar43) * iVar57;
                    puVar2[1] = (uint)(iVar58 < iVar52) * iVar52 | (uint)(iVar58 >= iVar52) * iVar58
                    ;
                    puVar2[2] = (uint)(iVar59 < iVar54) * iVar54 | (uint)(iVar59 >= iVar54) * iVar59
                    ;
                    puVar2[3] = (uint)(iVar60 < iVar56) * iVar56 | (uint)(iVar60 >= iVar56) * iVar60
                    ;
                    iVar18 = uVar39 - gap;
                    iVar24 = uVar40 - gap;
                    iVar19 = uVar41 - gap;
                    iVar57 = uVar42 - gap;
                    uVar39 = (uint)(iVar18 < iVar43) * iVar43 | (uint)(iVar18 >= iVar43) * iVar18;
                    uVar40 = (uint)(iVar24 < iVar52) * iVar52 | (uint)(iVar24 >= iVar52) * iVar24;
                    uVar41 = (uint)(iVar19 < iVar54) * iVar54 | (uint)(iVar19 >= iVar54) * iVar19;
                    uVar42 = (uint)(iVar57 < iVar56) * iVar56 | (uint)(iVar57 >= iVar56) * iVar57;
                    piVar1 = (int *)((long)*ptr_02 + lVar25);
                    iVar44 = *piVar1;
                    iVar18 = piVar1[1];
                    iVar24 = piVar1[2];
                    iVar19 = piVar1[3];
                    lVar25 = lVar25 + 0x10;
                    lVar23 = lVar23 + uVar22 * 4;
                  } while (lVar20 != lVar25);
                  uVar42 = 0;
                  do {
                    bVar28 = true;
                    uVar26 = 1;
                    lVar25 = 0;
                    lVar23 = lVar27;
                    uVar49 = ptr_01[uVar15 + 1] - open;
                    uVar51 = uVar39;
                    uVar53 = uVar40;
                    uVar55 = uVar41;
                    do {
                      piVar1 = (int *)((long)*ptr + lVar25);
                      iVar18 = *piVar1;
                      iVar24 = piVar1[1];
                      iVar19 = piVar1[2];
                      iVar3 = piVar1[3];
                      uVar45 = (iVar18 < (int)uVar49) * uVar49 |
                               (uint)(iVar18 >= (int)uVar49) * iVar18;
                      uVar46 = (iVar24 < (int)uVar51) * uVar51 |
                               (uint)(iVar24 >= (int)uVar51) * iVar24;
                      uVar47 = (iVar19 < (int)uVar53) * uVar53 |
                               (uint)(iVar19 >= (int)uVar53) * iVar19;
                      uVar48 = (iVar3 < (int)uVar55) * uVar55 | (uint)(iVar3 >= (int)uVar55) * iVar3
                      ;
                      puVar2 = (uint *)((long)*ptr + lVar25);
                      *puVar2 = uVar45;
                      puVar2[1] = uVar46;
                      puVar2[2] = uVar47;
                      puVar2[3] = uVar48;
                      piVar1 = ((ppVar10->field_4).rowcols)->score_row;
                      *(uint *)((long)piVar1 + lVar23) = uVar45;
                      lVar12 = (long)piVar1 + lVar23;
                      *(uint *)(lVar21 * 4 + lVar12) = uVar46;
                      *(uint *)(lVar21 * 8 + lVar12) = uVar47;
                      *(uint *)(lVar21 * 0xc + lVar12) = uVar48;
                      uVar35 = ((int)uVar45 < (int)uVar35) * uVar45 |
                               ((int)uVar45 >= (int)uVar35) * uVar35;
                      uVar36 = ((int)uVar46 < (int)uVar36) * uVar46 |
                               ((int)uVar46 >= (int)uVar36) * uVar36;
                      uVar37 = ((int)uVar47 < (int)uVar37) * uVar47 |
                               ((int)uVar47 >= (int)uVar37) * uVar37;
                      uVar38 = ((int)uVar48 < (int)uVar38) * uVar48 |
                               ((int)uVar48 >= (int)uVar38) * uVar38;
                      uVar30 = ((int)uVar30 < (int)uVar45) * uVar45 |
                               ((int)uVar30 >= (int)uVar45) * uVar30;
                      uVar32 = ((int)uVar32 < (int)uVar46) * uVar46 |
                               ((int)uVar32 >= (int)uVar46) * uVar32;
                      uVar33 = ((int)uVar33 < (int)uVar47) * uVar47 |
                               ((int)uVar33 >= (int)uVar47) * uVar33;
                      uVar34 = ((int)uVar34 < (int)uVar48) * uVar48 |
                               ((int)uVar34 >= (int)uVar48) * uVar34;
                      uVar39 = uVar49 - gap;
                      uVar40 = uVar51 - gap;
                      uVar41 = uVar53 - gap;
                      uVar55 = uVar55 - gap;
                      auVar50._0_4_ = -(uint)((int)(uVar45 - open) < (int)uVar39);
                      auVar50._4_4_ = -(uint)((int)(uVar46 - open) < (int)uVar40);
                      auVar50._8_4_ = -(uint)((int)(uVar47 - open) < (int)uVar41);
                      auVar50._12_4_ = -(uint)((int)(uVar48 - open) < (int)uVar55);
                      iVar18 = movmskps((int)lVar12,auVar50);
                      if (iVar18 == 0) break;
                      bVar28 = uVar26 < uVar17;
                      lVar25 = lVar25 + 0x10;
                      lVar23 = lVar23 + uVar22 * 4;
                      uVar26 = uVar26 + 1;
                      uVar49 = uVar39;
                      uVar51 = uVar40;
                      uVar53 = uVar41;
                    } while (lVar20 != lVar25);
                  } while ((!bVar28) && (bVar28 = uVar42 < 3, uVar42 = uVar42 + 1, bVar28));
                  uVar15 = uVar15 + 1;
                  lVar27 = lVar27 + 4;
                  palVar11 = ptr_02;
                  if (uVar15 == uVar14) {
                    iVar18 = (iVar6 % iVar16) * 0x10;
                    uVar22 = ptr[(uint)(iVar6 % iVar16)][0];
                    uVar17 = ptr[(uint)(iVar6 % iVar16)][1];
                    if (iVar6 / iVar16 < 3) {
                      iVar18 = 1;
                      if (1 < iVar9) {
                        iVar18 = iVar9;
                      }
                      do {
                        uVar17 = uVar17 << 0x20 | uVar22 >> 0x20;
                        iVar18 = iVar18 + -1;
                        uVar22 = uVar22 << 0x20;
                      } while (iVar18 != 0);
                    }
                    auVar29._0_4_ = -(uint)((int)uVar35 < (int)uVar13);
                    auVar29._4_4_ = -(uint)((int)uVar36 < (int)uVar13);
                    auVar29._8_4_ = -(uint)((int)uVar37 < (int)uVar13);
                    auVar29._12_4_ = -(uint)((int)uVar38 < (int)uVar13);
                    auVar31._0_4_ = -(uint)((int)uVar7 < (int)uVar30);
                    auVar31._4_4_ = -(uint)((int)uVar7 < (int)uVar32);
                    auVar31._8_4_ = -(uint)((int)uVar7 < (int)uVar33);
                    auVar31._12_4_ = -(uint)((int)uVar7 < (int)uVar34);
                    iVar18 = movmskps(iVar18,auVar31 | auVar29);
                    if (iVar18 == 0) {
                      iVar18 = (int)(uVar17 >> 0x20);
                    }
                    else {
                      *(byte *)&ppVar10->flag = (byte)ppVar10->flag | 0x40;
                      iVar18 = 0;
                      iVar8 = 0;
                      iVar6 = 0;
                    }
                    ppVar10->score = iVar18;
                    ppVar10->end_query = iVar6;
                    ppVar10->end_ref = iVar8;
                    parasail_free(ptr_01);
                    parasail_free(ptr_00);
                    parasail_free(ptr_02);
                    parasail_free(ptr);
                    return ppVar10;
                  }
                } while( true );
              }
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict vProfile = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvE = NULL;
    int32_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int32_t NEG_LIMIT = 0;
    int32_t POS_LIMIT = 0;
    int32_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile32.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 4; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile = (__m128i*)profile->profile32.score;
    vGapO = _mm_set1_epi32(open);
    vGapE = _mm_set1_epi32(gap);
    NEG_LIMIT = (-open < matrix->min ? INT32_MIN + open : INT32_MIN - matrix->min) + 1;
    POS_LIMIT = INT32_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi32(NEG_LIMIT);
    vPosLimit = _mm_set1_epi32(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_4;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m128i(16, segLen);
    pvHLoad  = parasail_memalign___m128i(16, segLen);
    pvE      = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int32_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvE) return NULL;
    if (!boundary) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_32_t h;
            __m128i_32_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT32_MIN ? INT32_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT32_MIN ? INT32_MIN : tmp;
            }
            _mm_store_si128(&pvHStore[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT32_MIN ? INT32_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        /* Initialize F value to -inf.  Any errors to vH values will be
         * corrected in the Lazy_F loop.  */
        __m128i vF = vNegLimit;

        /* load final segment of pvHStore and shift left by 2 bytes */
        __m128i vH = _mm_slli_si128(pvHStore[segLen - 1], 4);

        /* Correct part of the vProfile */
        const __m128i* vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        __m128i* pv = pvHLoad;
        pvHLoad = pvHStore;
        pvHStore = pv;

        /* insert upper boundary condition */
        vH = _mm_insert_epi32(vH, boundary[j], 0);

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm_add_epi32(vH, _mm_load_si128(vP + i));
            vE = _mm_load_si128(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm_max_epi32(vH, vE);
            vH = _mm_max_epi32(vH, vF);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);
            vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vH);
            vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vE);
            vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vF);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif

            /* Update vE value. */
            vH = _mm_sub_epi32(vH, vGapO);
            vE = _mm_sub_epi32(vE, vGapE);
            vE = _mm_max_epi32(vE, vH);
            _mm_store_si128(pvE + i, vE);

            /* Update vF value. */
            vF = _mm_sub_epi32(vF, vGapE);
            vF = _mm_max_epi32(vF, vH);

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            int64_t tmp = boundary[j+1]-open;
            int32_t tmp2 = tmp < INT32_MIN ? INT32_MIN : tmp;
            vF = _mm_slli_si128(vF, 4);
            vF = _mm_insert_epi32(vF, tmp2, 0);
            for (i=0; i<segLen; ++i) {
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi32(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
                vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
                arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                vH = _mm_sub_epi32(vH, vGapO);
                vF = _mm_sub_epi32(vF, vGapE);
                if (! _mm_movemask_epi8(_mm_cmpgt_epi32(vF, vH))) goto end;
                /*vF = _mm_max_epi32(vF, vH);*/
            }
        }
end:
        {
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm_load_si128(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 4);
            }
            result->rowcols->score_row[j] = (int32_t) _mm_extract_epi32 (vH, 3);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvHStore+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m128i vH = _mm_load_si128(pvHStore + offset);
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128 (vH, 4);
        }
        score = (int32_t) _mm_extract_epi32 (vH, 3);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi32(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi32(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(boundary);
    parasail_free(pvE);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}